

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall
cmQtAutoGenInitializer::AddToSourceGroup
          (cmQtAutoGenInitializer *this,string *fileName,string *genNameUpper)

{
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  size_type sVar3;
  cmState *this_01;
  char *__s;
  cmSourceGroup *this_02;
  long lVar4;
  long *plVar5;
  string *prop;
  string groupName;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> props;
  string property;
  string local_d8;
  string local_b8;
  long *local_98 [2];
  long local_88 [2];
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  string *local_58;
  string local_50;
  
  this_00 = this->Target->Target->Makefile;
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  pcVar1 = (genNameUpper->_M_dataplus)._M_p;
  local_58 = fileName;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + genNameUpper->_M_string_length);
  std::__cxx11::string::append((char *)&local_b8);
  plVar5 = local_88;
  local_98[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"AUTOGEN_SOURCE_GROUP","");
  lVar4 = 0;
  do {
    this_01 = cmMakefile::GetState(this_00);
    prop = (string *)((long)&local_b8._M_dataplus._M_p + lVar4);
    __s = cmState::GetGlobalProperty(this_01,prop);
    sVar3 = local_d8._M_string_length;
    if ((__s != (char *)0x0) && (*__s != '\0')) {
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_d8,0,(char *)sVar3,(ulong)__s);
      std::__cxx11::string::operator=((string *)&local_78,(string *)prop);
      break;
    }
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x40);
  lVar4 = -0x40;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  bVar2 = true;
  if ((char *)local_d8._M_string_length != (char *)0x0) {
    this_02 = cmMakefile::GetOrCreateSourceGroup(this_00,&local_d8);
    if (this_02 != (cmSourceGroup *)0x0) goto LAB_001e0982;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_append((char *)&local_b8,(ulong)(genNameUpper->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_b8);
    std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_78);
    std::__cxx11::string::append((char *)&local_b8);
    cmQtAutoGen::Quoted(&local_50,&local_d8);
    std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::Error(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                               local_b8.field_2._M_local_buf[0]) + 1);
    }
    bVar2 = false;
  }
  this_02 = (cmSourceGroup *)0x0;
LAB_001e0982:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  if (!(bool)(bVar2 ^ 1U | this_02 == (cmSourceGroup *)0x0)) {
    cmSourceGroup::AddGroupFile(this_02,local_58);
  }
  return bVar2;
}

Assistant:

bool cmQtAutoGenInitializer::AddToSourceGroup(std::string const& fileName,
                                              std::string const& genNameUpper)
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  cmSourceGroup* sourceGroup = nullptr;
  // Acquire source group
  {
    std::string property;
    std::string groupName;
    {
      // Prefer generator specific source group name
      std::array<std::string, 2> props{ { genNameUpper + "_SOURCE_GROUP",
                                          "AUTOGEN_SOURCE_GROUP" } };
      for (std::string& prop : props) {
        const char* propName = makefile->GetState()->GetGlobalProperty(prop);
        if ((propName != nullptr) && (*propName != '\0')) {
          groupName = propName;
          property = std::move(prop);
          break;
        }
      }
    }
    // Generate a source group on demand
    if (!groupName.empty()) {
      sourceGroup = makefile->GetOrCreateSourceGroup(groupName);
      if (sourceGroup == nullptr) {
        std::string err;
        err += genNameUpper;
        err += " error in ";
        err += property;
        err += ": Could not find or create the source group ";
        err += cmQtAutoGen::Quoted(groupName);
        cmSystemTools::Error(err);
        return false;
      }
    }
  }
  if (sourceGroup != nullptr) {
    sourceGroup->AddGroupFile(fileName);
  }
  return true;
}